

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::insert
          (prevector<8U,_int,_unsigned_int,_int> *this,iterator pos,size_type count,int *value)

{
  char *pcVar1;
  long lVar2;
  prevector<8U,_int,_unsigned_int,_int> *ppVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  long in_FS_OFFSET;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = this->_size;
  uVar7 = uVar8 - 9;
  ppVar3 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
  if (uVar8 < 9) {
    uVar7 = uVar8;
    ppVar3 = this;
  }
  uVar9 = 8;
  if (uVar8 >= 9) {
    uVar9 = (this->_union).indirect_contents.capacity;
  }
  uVar7 = uVar7 + count;
  if (uVar9 < uVar7) {
    change_capacity(this,(uVar7 >> 1) + uVar7);
  }
  uVar8 = this->_size;
  iVar14 = (int)((ulong)((long)pos.ptr - (long)ppVar3) >> 2);
  lVar11 = (long)iVar14 * 4;
  pcVar1 = (char *)((long)&this->_union + (long)iVar14 * 4);
  pcVar12 = (this->_union).indirect_contents.indirect + lVar11;
  if (uVar8 < 9) {
    pcVar12 = pcVar1;
  }
  uVar7 = uVar8 - 9;
  if (uVar8 < 9) {
    uVar7 = uVar8;
  }
  memmove(pcVar12 + (ulong)count * 4,pcVar12,(ulong)(uVar7 - iVar14) << 2);
  uVar8 = this->_size + count;
  this->_size = uVar8;
  auVar6 = _DAT_00e6c2d0;
  auVar5 = _DAT_00e6c2c0;
  auVar4 = _DAT_00e6c2b0;
  if (count != 0) {
    pcVar12 = (this->_union).indirect_contents.indirect + lVar11;
    if (uVar8 < 9) {
      pcVar12 = pcVar1;
    }
    iVar14 = *value;
    uVar13 = (ulong)count + 0x3fffffffffffffff;
    uVar10 = uVar13 & 0x3fffffffffffffff;
    auVar15._8_4_ = (int)uVar10;
    auVar15._0_8_ = uVar10;
    auVar15._12_4_ = (int)(uVar10 >> 0x20);
    lVar11 = 0;
    auVar15 = auVar15 ^ _DAT_00e6c2d0;
    do {
      auVar17._8_4_ = (int)lVar11;
      auVar17._0_8_ = lVar11;
      auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar18 = (auVar17 | auVar5) ^ auVar6;
      iVar16 = auVar15._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar16 && auVar15._0_4_ < auVar18._0_4_ ||
                  iVar16 < auVar18._4_4_) & 1)) {
        *(int *)(pcVar12 + lVar11 * 4) = iVar14;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        *(int *)(pcVar12 + lVar11 * 4 + 4) = iVar14;
      }
      auVar17 = (auVar17 | auVar4) ^ auVar6;
      iVar19 = auVar17._4_4_;
      if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar17._0_4_ <= auVar15._0_4_)) {
        *(int *)(pcVar12 + lVar11 * 4 + 8) = iVar14;
        *(int *)(pcVar12 + lVar11 * 4 + 0xc) = iVar14;
      }
      lVar11 = lVar11 + 4;
    } while ((uVar10 - ((uint)uVar13 & 3)) + 4 != lVar11);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(iterator pos, size_type count, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + count;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + count;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size += count;
        fill(item_ptr(p), count, value);
    }